

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_256UL,_128UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>_conflict transaction;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_230;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>_conflict local_218;
  TestObject<256UL,_128UL> local_200;
  
  TestObject<256UL,_128UL>::TestObject(&local_200);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::start_reentrant_push<density_tests::TestObject<256ul,128ul>>
            (&local_218,
             (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)i_queue,&local_200);
  pcVar1 = local_218.m_queue;
  local_230.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       local_218.m_queue;
  local_230.m_put_data.m_control_block = local_218.m_put_data.m_control_block;
  local_230.m_put_data.m_user_storage = local_218.m_put_data.m_user_storage;
  local_218.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> *)&local_218);
  TestObject<256UL,_128UL>::~TestObject(&local_200);
  exception_checkpoint();
  __return_storage_ptr__->m_queue = pcVar1;
  (__return_storage_ptr__->m_put_data).m_control_block = local_230.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_data).m_user_storage = local_230.m_put_data.m_user_storage;
  local_230.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_230);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }